

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GetUInt32(char *z,u32 *pI)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  u32 uVar4;
  ulong uVar5;
  
  lVar3 = 0;
  uVar5 = 0;
  do {
    bVar1 = z[lVar3];
    if ((ulong)bVar1 - 0x3a < 0xfffffffffffffff6) {
      uVar4 = (u32)uVar5;
      if (bVar1 != 0 || lVar3 == 0) {
        uVar4 = 0;
      }
      uVar2 = (uint)(bVar1 == 0 && lVar3 != 0);
LAB_00152ef1:
      *pI = uVar4;
      return uVar2;
    }
    uVar5 = (uVar5 * 10 + (long)(char)bVar1) - 0x30;
    if (0x100000000 < uVar5) {
      uVar4 = 0;
      uVar2 = 0;
      goto LAB_00152ef1;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3GetUInt32(const char *z, u32 *pI){
  u64 v = 0;
  int i;
  for(i=0; sqlite3Isdigit(z[i]); i++){
    v = v*10 + z[i] - '0';
    if( v>4294967296LL ){ *pI = 0; return 0; }
  }
  if( i==0 || z[i]!=0 ){ *pI = 0; return 0; }
  *pI = (u32)v;
  return 1;
}